

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SetPermissions(string *file,mode_t mode)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = FileExists(file);
  if (bVar1) {
    iVar2 = chmod((file->_M_dataplus)._M_p,mode);
    bVar1 = -1 < iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const kwsys_stl::string& file, mode_t mode)
{
  if ( !SystemTools::FileExists(file) )
    {
    return false;
    }
#ifdef _WIN32
  if ( _wchmod(SystemTools::ConvertToWindowsExtendedPath(file).c_str(),
               mode) < 0 )
#else
  if ( chmod(file.c_str(), mode) < 0 )
#endif
    {
    return false;
    }

  return true;
}